

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O3

int send_handshake_done(quicly_conn_t *conn,quicly_send_context_t *s)

{
  uint64_t *puVar1;
  uint8_t *puVar2;
  int iVar3;
  quicly_sent_t *sent;
  quicly_sent_t *pqStack_18;
  
  iVar3 = allocate_ack_eliciting_frame(conn,s,1,&pqStack_18,on_ack_handshake_done);
  if (iVar3 == 0) {
    puVar2 = s->dst;
    s->dst = puVar2 + 1;
    *puVar2 = '\x1e';
    puVar2 = &(conn->egress).pending_flows;
    *puVar2 = *puVar2 & 0xbf;
    puVar1 = &(conn->super).stats.num_frames_sent.handshake_done;
    *puVar1 = *puVar1 + 1;
  }
  return iVar3;
}

Assistant:

static int send_handshake_done(quicly_conn_t *conn, quicly_send_context_t *s)
{
    quicly_sent_t *sent;
    int ret;

    if ((ret = allocate_ack_eliciting_frame(conn, s, 1, &sent, on_ack_handshake_done)) != 0)
        goto Exit;
    *s->dst++ = QUICLY_FRAME_TYPE_HANDSHAKE_DONE;
    conn->egress.pending_flows &= ~QUICLY_PENDING_FLOW_HANDSHAKE_DONE_BIT;
    ++conn->super.stats.num_frames_sent.handshake_done;
    QUICLY_PROBE(HANDSHAKE_DONE_SEND, conn, conn->stash.now);

    ret = 0;
Exit:
    return ret;
}